

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::ScaleRatioFromValueT<float,float,float>
                (ImGuiDataType data_type,float v,float v_min,float v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if ((v_min == v_max) && (!NAN(v_min) && !NAN(v_max))) {
    return 0.0;
  }
  fVar2 = v_max;
  fVar1 = v_min;
  if (v_max <= v_min) {
    fVar2 = v_min;
    fVar1 = v_max;
  }
  if (v <= fVar2) {
    fVar2 = v;
  }
  fVar1 = (float)(~-(uint)(v < fVar1) & (uint)fVar2 | (uint)fVar1 & -(uint)(v < fVar1));
  if (is_logarithmic) {
    fVar4 = v_min;
    fVar2 = v_max;
    if (v_min <= v_max) {
      fVar4 = v_max;
      fVar2 = v_min;
    }
    fVar5 = fVar2;
    if (ABS(fVar2) < logarithmic_zero_epsilon) {
      fVar5 = (float)(~-(uint)(fVar2 < 0.0) & (uint)logarithmic_zero_epsilon |
                     (uint)-logarithmic_zero_epsilon & -(uint)(fVar2 < 0.0));
    }
    fVar6 = fVar4;
    if (ABS(fVar4) < logarithmic_zero_epsilon) {
      fVar6 = (float)(~-(uint)(fVar4 < 0.0) & (uint)logarithmic_zero_epsilon |
                     (uint)-logarithmic_zero_epsilon & -(uint)(fVar4 < 0.0));
    }
    if (((fVar2 != 0.0) || (NAN(fVar2))) || (0.0 <= fVar4)) {
      if (((fVar4 == 0.0) && (!NAN(fVar4))) && (fVar2 < 0.0)) {
        fVar6 = -logarithmic_zero_epsilon;
      }
    }
    else {
      fVar5 = -logarithmic_zero_epsilon;
    }
    fVar3 = 0.0;
    if (fVar5 < fVar1) {
      if (fVar6 <= fVar1) {
        fVar3 = 1.0;
      }
      else if (0.0 <= v_min * v_max) {
        if ((fVar2 < 0.0) || (fVar4 < 0.0)) {
          fVar1 = logf(fVar1 / fVar6);
          fVar2 = logf(fVar5 / fVar6);
          fVar3 = 1.0 - fVar1 / fVar2;
        }
        else {
          fVar3 = logf(fVar1 / fVar5);
          fVar1 = logf(fVar6 / fVar5);
          fVar3 = fVar3 / fVar1;
        }
      }
      else {
        fVar3 = -fVar2 / (fVar4 - fVar2);
        if ((v != 0.0) || (NAN(v))) {
          if (0.0 <= v) {
            fVar1 = logf(fVar1 / logarithmic_zero_epsilon);
            fVar2 = logf(fVar6 / logarithmic_zero_epsilon);
            fVar3 = fVar3 + zero_deadzone_halfsize +
                    (1.0 - (fVar3 + zero_deadzone_halfsize)) * (fVar1 / fVar2);
          }
          else {
            fVar1 = logf(-fVar1 / logarithmic_zero_epsilon);
            fVar2 = logf(-fVar5 / logarithmic_zero_epsilon);
            fVar3 = (fVar3 - zero_deadzone_halfsize) * (1.0 - fVar1 / fVar2);
          }
        }
      }
    }
    return (float)(~-(uint)(v_max < v_min) & (uint)fVar3 |
                  (uint)(1.0 - fVar3) & -(uint)(v_max < v_min));
  }
  return (fVar1 - v_min) / (v_max - v_min);
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;
        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }
    else
    {
        // Linear slider
        return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
    }
}